

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O1

bool MeCab::Viterbi::forwardbackward(Lattice *lattice)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  bool bVar12;
  float extraout_XMM0_Da;
  double dVar13;
  double dVar14;
  double local_58;
  long lVar5;
  long lVar6;
  
  iVar2 = (*lattice->_vptr_Lattice[0x12])(lattice,8);
  if ((char)iVar2 != '\0') {
    iVar2 = (*lattice->_vptr_Lattice[5])(lattice);
    iVar3 = (*lattice->_vptr_Lattice[4])(lattice);
    lVar5 = CONCAT44(extraout_var_00,iVar3);
    uVar4 = (*lattice->_vptr_Lattice[0xb])(lattice);
    lVar6 = CONCAT44(extraout_var_01,uVar4);
    (*lattice->_vptr_Lattice[0xf])(lattice);
    local_58 = (double)extraout_XMM0_Da;
    *(undefined4 *)(*(long *)CONCAT44(extraout_var,iVar2) + 0x54) = 0;
    if (-1 < extraout_var_01) {
      lVar8 = 0;
      do {
        for (lVar7 = *(long *)(lVar5 + lVar8 * 8); lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x18)) {
          *(undefined4 *)(lVar7 + 0x54) = 0;
          for (lVar11 = *(long *)(lVar7 + 0x28); lVar11 != 0; lVar11 = *(long *)(lVar11 + 0x18)) {
            dVar14 = (double)*(int *)(lVar11 + 0x20) * -local_58 +
                     (double)*(float *)(*(long *)(lVar11 + 0x10) + 0x54);
            if (lVar11 != *(long *)(lVar7 + 0x28)) {
              dVar13 = (double)*(float *)(lVar7 + 0x54);
              dVar1 = dVar14;
              if (dVar13 <= dVar14) {
                dVar1 = dVar13;
              }
              if (dVar14 <= dVar13) {
                dVar14 = dVar13;
              }
              if (dVar14 <= dVar1 + 50.0) {
                dVar1 = exp(dVar1 - dVar14);
                dVar1 = log(dVar1 + 1.0);
                dVar14 = dVar14 + dVar1;
              }
            }
            *(float *)(lVar7 + 0x54) = (float)dVar14;
          }
        }
        bVar12 = lVar8 != lVar6;
        lVar8 = lVar8 + 1;
      } while (bVar12);
    }
    *(undefined4 *)(*(long *)(lVar5 + lVar6 * 8) + 0x58) = 0;
    if (-1 < (int)uVar4) {
      uVar9 = (ulong)(uVar4 & 0x7fffffff);
      do {
        for (lVar8 = ((long *)CONCAT44(extraout_var,iVar2))[uVar9]; lVar8 != 0;
            lVar8 = *(long *)(lVar8 + 0x10)) {
          *(undefined4 *)(lVar8 + 0x58) = 0;
          for (plVar10 = *(long **)(lVar8 + 0x20); plVar10 != (long *)0x0;
              plVar10 = (long *)plVar10[1]) {
            dVar14 = (double)(int)plVar10[4] * -local_58 + (double)*(float *)(*plVar10 + 0x58);
            if (plVar10 != *(long **)(lVar8 + 0x20)) {
              dVar13 = (double)*(float *)(lVar8 + 0x58);
              dVar1 = dVar14;
              if (dVar13 <= dVar14) {
                dVar1 = dVar13;
              }
              if (dVar14 <= dVar13) {
                dVar14 = dVar13;
              }
              if (dVar14 <= dVar1 + 50.0) {
                dVar1 = exp(dVar1 - dVar14);
                dVar1 = log(dVar1 + 1.0);
                dVar14 = dVar14 + dVar1;
              }
            }
            *(float *)(lVar8 + 0x58) = (float)dVar14;
          }
        }
        bVar12 = 0 < (long)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar12);
    }
    dVar14 = (double)*(float *)(*(long *)(lVar5 + lVar6 * 8) + 0x54);
    (*lattice->_vptr_Lattice[0xc])();
    if (-1 < extraout_var_01) {
      local_58 = -local_58;
      lVar8 = 0;
      do {
        for (lVar7 = *(long *)(lVar5 + lVar8 * 8); lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x18)) {
          dVar1 = exp((double)(*(float *)(lVar7 + 0x54) + *(float *)(lVar7 + 0x58)) - dVar14);
          *(float *)(lVar7 + 0x5c) = (float)dVar1;
          for (plVar10 = *(long **)(lVar7 + 0x28); plVar10 != (long *)0x0;
              plVar10 = (long *)plVar10[3]) {
            dVar1 = exp(((double)*(float *)(*plVar10 + 0x58) +
                        (double)(int)plVar10[4] * local_58 + (double)*(float *)(plVar10[2] + 0x54))
                        - dVar14);
            *(float *)((long)plVar10 + 0x24) = (float)dVar1;
          }
        }
        bVar12 = lVar8 != lVar6;
        lVar8 = lVar8 + 1;
      } while (bVar12);
    }
  }
  return true;
}

Assistant:

bool Viterbi::forwardbackward(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_MARGINAL_PROB)) {
    return true;
  }

  Node **end_node_list   = lattice->end_nodes();
  Node **begin_node_list = lattice->begin_nodes();

  const size_t len = lattice->size();
  const double theta = lattice->theta();

  end_node_list[0]->alpha = 0.0;
  for (int pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      calc_alpha(node, theta);
    }
  }

  begin_node_list[len]->beta = 0.0;
  for (int pos = static_cast<long>(len); pos >= 0; --pos) {
    for (Node *node = end_node_list[pos]; node; node = node->enext) {
      calc_beta(node, theta);
    }
  }

  const double Z = begin_node_list[len]->alpha;
  lattice->set_Z(Z);  // alpha of EOS

  for (int pos = 0; pos <= static_cast<long>(len); ++pos) {
    for (Node *node = begin_node_list[pos]; node; node = node->bnext) {
      node->prob = std::exp(node->alpha + node->beta - Z);
      for (Path *path = node->lpath; path; path = path->lnext) {
        path->prob = std::exp(path->lnode->alpha
                              - theta * path->cost
                              + path->rnode->beta - Z);
      }
    }
  }

  return true;
}